

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

void __thiscall cfd::core::Pubkey::Pubkey(Pubkey *this,ByteData *byte_data)

{
  bool bVar1;
  undefined8 uVar2;
  ByteData *in_stack_ffffffffffffff58;
  ByteData *in_stack_ffffffffffffff60;
  allocator *paVar3;
  string *message;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 uVar4;
  CfdError error_code;
  CfdException *in_stack_ffffffffffffff80;
  string local_60;
  CfdSourceLocation local_40;
  ByteData *local_18;
  ByteData *byte_data_local;
  Pubkey *this_local;
  
  message = (string *)this;
  local_18 = byte_data;
  byte_data_local = &this->data_;
  ByteData::ByteData(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  bVar1 = IsValid((ByteData *)message);
  uVar4 = CONCAT22((short)((uint)in_stack_ffffffffffffff7c >> 0x10),
                   CONCAT11(bVar1,(char)in_stack_ffffffffffffff7c));
  if (!bVar1) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_key.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x2d;
    local_40.funcname = "Pubkey";
    ByteData::GetHex_abi_cxx11_(&local_60,&this->data_);
    logger::warn<std::__cxx11::string>(&local_40,"Invalid Pubkey data. hex={}.",&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
    error_code = CONCAT13(SUB41((uint)uVar4 >> 0x18,0),CONCAT12(1,(short)uVar4));
    uVar2 = __cxa_allocate_exception(0x30);
    paVar3 = (allocator *)&stack0xffffffffffffff7f;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&stack0xffffffffffffff80,"Invalid Pubkey data.",paVar3)
    ;
    CfdException::CfdException(in_stack_ffffffffffffff80,error_code,message);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

Pubkey::Pubkey(ByteData byte_data) : data_(byte_data) {
  if (!Pubkey::IsValid(data_)) {
    warn(CFD_LOG_SOURCE, "Invalid Pubkey data. hex={}.", data_.GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Pubkey data.");
  }
}